

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cforeach.c
# Opt level: O3

char * cforeach_openTag(FILE *out,char *line)

{
  csafestring_t *obj;
  csafestring_t *obj_00;
  csafestring_t *obj_01;
  csafestring_t *obj_02;
  csafestring_t *obj_03;
  csafestring_t *obj_04;
  char *pcVar1;
  
  obj = modules_extractVariable(line,"var");
  obj_00 = modules_extractVariable(line,"statusVar");
  obj_01 = modules_extractVariable(line,"begin");
  obj_02 = modules_extractVariable(line,"end");
  obj_03 = modules_extractVariable(line,"step");
  obj_04 = modules_extractVariable(line,"items");
  if (obj_00 == (csafestring_t *)0x0 ||
      (obj_04 == (csafestring_t *)0x0 || obj == (csafestring_t *)0x0)) {
    if (obj_02 != (csafestring_t *)0x0 &&
        (obj_01 != (csafestring_t *)0x0 && obj != (csafestring_t *)0x0)) {
      fwrite("for ( ",6,1,(FILE *)out);
      fprintf((FILE *)out,
              "setVariable(__internal_mfunction, __internal_root, \"%s\", __internal_hfunction->intToString(__internal_expressionString, EXPR_STRING_LENGTH, %s));\n"
              ,obj->data,obj_01->data);
      fwrite("atoi(",5,1,(FILE *)out);
      fprintf((FILE *)out,"getVariable(__internal_mfunction, __internal_root, \"%s\")",obj->data);
      fprintf((FILE *)out,") <= %s;",obj_02->data);
      fprintf((FILE *)out,"setVariable(__internal_mfunction, __internal_root, \"%s\", ",obj->data);
      fwrite("__internal_hfunction->intToString(__internal_expressionString, EXPR_STRING_LENGTH,",
             0x52,1,(FILE *)out);
      fwrite("atoi(",5,1,(FILE *)out);
      fprintf((FILE *)out,"getVariable(__internal_mfunction, __internal_root, \"%s\")",obj->data);
      if (obj_03 == (csafestring_t *)0x0) {
        fwrite(") + 1",5,1,(FILE *)out);
      }
      else {
        fprintf((FILE *)out,") + %s",obj_03->data);
      }
      fputc(0x29,(FILE *)out);
      fputc(0x29,(FILE *)out);
      fwrite(") {\n",4,1,(FILE *)out);
    }
  }
  else {
    fwrite("for ( ",6,1,(FILE *)out);
    fprintf((FILE *)out,
            "setVariable(__internal_mfunction, __internal_root, \"%s\", __internal_hfunction->intToString(__internal_expressionString, EXPR_STRING_LENGTH, 0));\n"
            ,obj_00->data);
    fwrite("atoi(",5,1,(FILE *)out);
    fprintf((FILE *)out,"getVariable(__internal_mfunction, __internal_root, \"%s\")",obj_00->data);
    fwrite(") < atoi(",9,1,(FILE *)out);
    fprintf((FILE *)out,"getVariable(__internal_mfunction, __internal_root, \"%s\")",obj_04->data);
    fwrite(");",2,1,(FILE *)out);
    fprintf((FILE *)out,"setVariable(__internal_mfunction, __internal_root, \"%s\", ",obj_00->data);
    fwrite("__internal_hfunction->intToString(__internal_expressionString, EXPR_STRING_LENGTH,",0x52
           ,1,(FILE *)out);
    fwrite("atoi(",5,1,(FILE *)out);
    fprintf((FILE *)out,"getVariable(__internal_mfunction, __internal_root, \"%s\")",obj_00->data);
    fwrite(") + 1",5,1,(FILE *)out);
    fputc(0x29,(FILE *)out);
    fputc(0x29,(FILE *)out);
    fwrite(") {\n",4,1,(FILE *)out);
    fprintf((FILE *)out,"strncpy(__internal_expressionString, \"%s\", 254);",obj_04->data);
    fwrite("strncat(__internal_expressionString, \"[\", 254);\n",0x30,1,(FILE *)out);
    fprintf((FILE *)out,
            "strncat(__internal_expressionString, getVariable(__internal_mfunction, __internal_root, \"%s\"), 254);\n"
            ,obj_00->data);
    fwrite("strncat(__internal_expressionString, \"]\", 254);\n",0x30,1,(FILE *)out);
    fwrite("__internal_tmp = getVariable(__internal_mfunction, __internal_root, __internal_expressionString);\n"
           ,0x62,1,(FILE *)out);
    fprintf((FILE *)out,
            "setVariable(__internal_mfunction, __internal_root, \"%s\", __internal_tmp);\n",
            obj->data);
  }
  safe_destroy(obj);
  safe_destroy(obj_00);
  safe_destroy(obj_01);
  safe_destroy(obj_02);
  safe_destroy(obj_03);
  safe_destroy(obj_04);
  pcVar1 = modules_findEndOfTag(line);
  return pcVar1 + 1;
}

Assistant:

static char *cforeach_openTag(FILE *out, char *line) {
	csafestring_t *var = modules_extractVariable(line, "var");
	csafestring_t *statusVar = modules_extractVariable(line, "statusVar");
	csafestring_t *begin = modules_extractVariable(line, "begin");
	csafestring_t *end = modules_extractVariable(line, "end");
	csafestring_t *step = modules_extractVariable(line, "step");
	csafestring_t *items = modules_extractVariable(line, "items");

	if ( var != NULL && items != NULL && statusVar != NULL ) {
		cforeach_elementLoop(out, var, statusVar, items);
	} else if ( var != NULL && begin != NULL && end != NULL ) {
		cforeach_counterLoop(out, var, begin, end, step);
	}

	safe_destroy(var);
	safe_destroy(statusVar);
	safe_destroy(begin);
	safe_destroy(end);
	safe_destroy(step);
	safe_destroy(items);
	return modules_findEndOfTag(line) + 1;
}